

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool __thiscall
ChainstateManager::AcceptBlock
          (ChainstateManager *this,shared_ptr<const_CBlock> *pblock,BlockValidationState *state,
          CBlockIndex **ppindex,bool fRequested,FlatFilePos *dbp,bool *fNewBlock,
          bool min_pow_checked)

{
  uint uVar1;
  long lVar2;
  _Head_base<0UL,_Chainstate_*,_false> _Var3;
  string_view source_file;
  byte bVar4;
  bool bVar5;
  int iVar6;
  BlockValidationResult BVar7;
  BlockManager *this_00;
  CBlockIndex *pCVar8;
  byte bVar9;
  ChainstateManager *in_RCX;
  FlatFilePos *in_RDX;
  size_t in_RSI;
  FlatFilePos *in_RDI;
  byte in_R8B;
  ChainstateManager *in_R9;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<CBlockIndex_*>,_bool> pVar10;
  CBlockIndex *unaff_retaddr;
  ChainstateManager *in_stack_00000008;
  byte in_stack_00000010;
  FlushStateMode in_stack_0000006c;
  BlockValidationState *in_stack_00000070;
  Chainstate *in_stack_00000078;
  runtime_error *e;
  CChainParams *params;
  bool fTooFarAhead;
  bool fHasMoreOrSameWork;
  bool fAlreadyHave;
  bool accepted_header;
  CBlockIndex **pindex;
  CBlock *block;
  FlatFilePos blockPos;
  CBlockIndex *pindexDummy;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 uVar11;
  int in_stack_fffffffffffffd9c;
  string *in_stack_fffffffffffffda0;
  ChainstateManager *in_stack_fffffffffffffda8;
  char *in_stack_fffffffffffffdb0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffdb8;
  char (*in_stack_fffffffffffffdc0) [12];
  undefined6 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdce;
  undefined1 in_stack_fffffffffffffdcf;
  ValidationState<BlockValidationResult> *in_stack_fffffffffffffdd8;
  shared_ptr<const_CBlock> *in_stack_fffffffffffffdf8;
  CBlock *in_stack_fffffffffffffe00;
  char *flag;
  undefined8 in_stack_fffffffffffffe18;
  uint nHeight;
  undefined4 in_stack_fffffffffffffe20;
  int iVar12;
  BlockManager *in_stack_fffffffffffffe28;
  bool local_1c9;
  ChainstateManager *pCVar13;
  ChainstateManager *pindex_00;
  ConstevalFormatString<2U> fmt;
  string_view in_stack_fffffffffffffe60;
  BlockManager *pBVar14;
  undefined7 in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb8;
  ChainstateManager *block_00;
  FlatFilePos *pos;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  ChainstateManager *in_stack_fffffffffffffee8;
  FlatFilePos local_108 [5];
  _Head_base<0UL,_Chainstate_*,_false> local_e0;
  _Head_base<0UL,_Chainstate_*,_false> local_d8;
  undefined1 local_d0;
  undefined1 in_stack_ffffffffffffff37;
  CBlockIndex *in_stack_ffffffffffffff38;
  Level in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  in_stack_ffffffffffffff48;
  ChainstateManager *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  
  nHeight = (uint)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar9 = in_R8B & 1;
  bVar4 = in_stack_00000010 & 1;
  fmt.fmt = (char *)in_RDX;
  block_00 = in_RCX;
  pos = in_RDI;
  this_00 = (BlockManager *)
            std::__shared_ptr_access<const_CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*((__shared_ptr_access<const_CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )in_stack_fffffffffffffda8);
  if (in_stack_00000008 != (ChainstateManager *)0x0) {
    *(undefined1 *)
     &(in_stack_00000008->m_ibd_chainstate)._M_t.
      super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
      super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
      super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl = 0;
  }
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0,
             in_stack_fffffffffffffd9c,(AnnotatedMixin<std::recursive_mutex> *)0x7e3cee);
  local_e0._M_head_impl = (Chainstate *)0x0;
  pCVar13 = block_00;
  if (block_00 == (ChainstateManager *)0x0) {
    pCVar13 = (ChainstateManager *)&stack0xffffffffffffff20;
  }
  pindex_00 = pCVar13;
  bVar5 = AcceptBlockHeader(in_stack_ffffffffffffff50,
                            (CBlockHeader *)in_stack_ffffffffffffff48.__d.__r,
                            (BlockValidationState *)
                            CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            (CBlockIndex **)in_stack_ffffffffffffff38,
                            (bool)in_stack_ffffffffffffff37);
  CheckBlockIndex(in_stack_00000008);
  if (bVar5) {
    uVar1 = *(uint *)&(((pCVar13->m_ibd_chainstate)._M_t.
                        super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                        super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                        super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl)->m_chain).vChain;
    pCVar8 = ActiveTip((ChainstateManager *)
                       CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    if (pCVar8 == (CBlockIndex *)0x0) {
      local_1c9 = true;
    }
    else {
      in_stack_fffffffffffffe28 =
           (BlockManager *)
           &((pCVar13->m_ibd_chainstate)._M_t.
             super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
             super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
             super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl)->m_mempool;
      ActiveTip((ChainstateManager *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      local_1c9 = operator>=((base_uint<256U> *)in_stack_fffffffffffffda8,
                             (base_uint<256U> *)in_stack_fffffffffffffda0);
    }
    iVar12 = *(int *)((long)&((pCVar13->m_ibd_chainstate)._M_t.
                              super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>
                              .super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl)->
                             m_chainstate_mutex + 0x18);
    iVar6 = ActiveHeight((ChainstateManager *)
                         CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    if ((uVar1 & 8) == 0) {
      if ((bVar9 & 1) == 0) {
        if (*(int *)&((pCVar13->m_ibd_chainstate)._M_t.
                      super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                      super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                      super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl)->m_blockman != 0) {
          bVar5 = true;
          goto LAB_007e44d5;
        }
        if (local_1c9 == false) {
          bVar5 = true;
          goto LAB_007e44d5;
        }
        if (iVar6 + 0x120 < iVar12) {
          bVar5 = true;
          goto LAB_007e44d5;
        }
        nHeight = (uint)((ulong)&((pCVar13->m_ibd_chainstate)._M_t.
                                  super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>
                                  .super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl)->
                                 m_mempool >> 0x20);
        MinimumChainWork((ChainstateManager *)
                         CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        bVar5 = ::operator<((base_uint<256U> *)in_stack_fffffffffffffda8,
                            (base_uint<256U> *)in_stack_fffffffffffffda0);
        if (bVar5) {
          bVar5 = true;
          goto LAB_007e44d5;
        }
      }
      GetParams((ChainstateManager *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      pBVar14 = this_00;
      CChainParams::GetConsensus
                ((CChainParams *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      bVar5 = CheckBlock((CBlock *)CONCAT17(bVar9,in_stack_fffffffffffffeb8),
                         (BlockValidationState *)in_R9,
                         (Params *)CONCAT17(bVar4,in_stack_fffffffffffffea8),
                         SUB81((ulong)pBVar14 >> 0x38,0),SUB81((ulong)pBVar14 >> 0x30,0));
      if ((bVar5) &&
         (bVar5 = ContextualCheckBlock
                            ((CBlock *)block_00,
                             (BlockValidationState *)CONCAT17(bVar9,in_stack_fffffffffffffeb8),in_R9
                             ,(CBlockIndex *)CONCAT17(bVar4,in_stack_fffffffffffffea8)), bVar5)) {
        bVar5 = IsInitialBlockDownload(in_RCX);
        if ((!bVar5) &&
           ((pCVar8 = ActiveTip((ChainstateManager *)
                                CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98)),
            pCVar8 == *(CBlockIndex **)
                       ((long)&((pCVar13->m_ibd_chainstate)._M_t.
                                super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>.
                                _M_t.
                                super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>
                                .super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl)->
                               m_chainstate_mutex + 8) && (in_RDI[0xfb] != (FlatFilePos)0x0)))) {
          ValidationSignals::NewPoWValidBlock
                    ((ValidationSignals *)in_stack_fffffffffffffe00,(CBlockIndex *)pindex_00,
                     in_stack_fffffffffffffdf8);
        }
        iVar6 = (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
        if (in_stack_00000008 != (ChainstateManager *)0x0) {
          *(undefined1 *)
           &(in_stack_00000008->m_ibd_chainstate)._M_t.
            super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
            super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
            super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl = 1;
        }
        memset(local_108,0,8);
        FlatFilePos::FlatFilePos
                  ((FlatFilePos *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        if (in_R9 == (ChainstateManager *)0x0) {
          local_108[0] = ::node::BlockManager::SaveBlockToDisk
                                   (this_00,in_stack_fffffffffffffe00,iVar6);
          bVar5 = FlatFilePos::IsNull((FlatFilePos *)
                                      CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98))
          ;
          if (bVar5) {
            tinyformat::format<char[12]>
                      ((char *)CONCAT17(in_stack_fffffffffffffdcf,
                                        CONCAT16(in_stack_fffffffffffffdce,in_stack_fffffffffffffdc8
                                                )),in_stack_fffffffffffffdc0);
            ValidationState<BlockValidationResult>::Error
                      ((ValidationState<BlockValidationResult> *)in_stack_fffffffffffffda8,
                       in_stack_fffffffffffffda0);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
            bVar5 = false;
            goto LAB_007e44d5;
          }
        }
        else {
          local_108[0] = (FlatFilePos)
                         (in_R9->m_ibd_chainstate)._M_t.
                         super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                         super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                         super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
          ::node::BlockManager::UpdateBlockInfo
                    (in_stack_fffffffffffffe28,(CBlock *)CONCAT44(iVar12,in_stack_fffffffffffffe20),
                     nHeight,in_RDX);
        }
        ReceivedBlockTransactions
                  (in_stack_fffffffffffffee8,
                   (CBlock *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                   unaff_retaddr,pos);
        ActiveChainstate(in_stack_fffffffffffffda8);
        Chainstate::FlushStateToDisk
                  (in_stack_00000078,in_stack_00000070,in_stack_0000006c,blockPos.nPos);
        CheckBlockIndex(in_stack_00000008);
        bVar5 = true;
      }
      else {
        iVar12 = (int)((ulong)this_00 >> 0x20);
        bVar5 = ValidationState<BlockValidationResult>::IsInvalid
                          ((ValidationState<BlockValidationResult> *)
                           CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        if ((bVar5) &&
           (BVar7 = ValidationState<BlockValidationResult>::GetResult
                              ((ValidationState<BlockValidationResult> *)
                               CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98)),
           BVar7 != BLOCK_MUTATED)) {
          _Var3._M_head_impl =
               (pCVar13->m_ibd_chainstate)._M_t.
               super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
               super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
               super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
          *(uint *)&((_Var3._M_head_impl)->m_chain).vChain =
               *(uint *)&((_Var3._M_head_impl)->m_chain).vChain | 0x20;
          pVar10 = std::set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>
                   ::insert((set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>
                             *)in_stack_fffffffffffffda8,(value_type *)in_stack_fffffffffffffda0);
          local_d8._M_head_impl = (Chainstate *)pVar10.first._M_node;
          local_d0 = pVar10.second;
        }
        flag = "AcceptBlock";
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
        ValidationState<BlockValidationResult>::ToString_abi_cxx11_(in_stack_fffffffffffffdd8);
        uVar11 = 4;
        source_file._M_str = (char *)in_RDI;
        source_file._M_len = in_RSI;
        LogPrintFormatInternal<char[12],std::__cxx11::string>
                  (in_stack_fffffffffffffe60,source_file,iVar12,(LogFlags)flag,
                   in_stack_ffffffffffffff40,fmt,(char (*) [12])in_stack_ffffffffffffff50,
                   in_stack_ffffffffffffff58);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd9c,uVar11));
        bVar5 = false;
      }
    }
    else {
      bVar5 = true;
    }
  }
  else {
    bVar5 = false;
  }
LAB_007e44d5:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool ChainstateManager::AcceptBlock(const std::shared_ptr<const CBlock>& pblock, BlockValidationState& state, CBlockIndex** ppindex, bool fRequested, const FlatFilePos* dbp, bool* fNewBlock, bool min_pow_checked)
{
    const CBlock& block = *pblock;

    if (fNewBlock) *fNewBlock = false;
    AssertLockHeld(cs_main);

    CBlockIndex *pindexDummy = nullptr;
    CBlockIndex *&pindex = ppindex ? *ppindex : pindexDummy;

    bool accepted_header{AcceptBlockHeader(block, state, &pindex, min_pow_checked)};
    CheckBlockIndex();

    if (!accepted_header)
        return false;

    // Check all requested blocks that we do not already have for validity and
    // save them to disk. Skip processing of unrequested blocks as an anti-DoS
    // measure, unless the blocks have more work than the active chain tip, and
    // aren't too far ahead of it, so are likely to be attached soon.
    bool fAlreadyHave = pindex->nStatus & BLOCK_HAVE_DATA;
    bool fHasMoreOrSameWork = (ActiveTip() ? pindex->nChainWork >= ActiveTip()->nChainWork : true);
    // Blocks that are too out-of-order needlessly limit the effectiveness of
    // pruning, because pruning will not delete block files that contain any
    // blocks which are too close in height to the tip.  Apply this test
    // regardless of whether pruning is enabled; it should generally be safe to
    // not process unrequested blocks.
    bool fTooFarAhead{pindex->nHeight > ActiveHeight() + int(MIN_BLOCKS_TO_KEEP)};

    // TODO: Decouple this function from the block download logic by removing fRequested
    // This requires some new chain data structure to efficiently look up if a
    // block is in a chain leading to a candidate for best tip, despite not
    // being such a candidate itself.
    // Note that this would break the getblockfrompeer RPC

    // TODO: deal better with return value and error conditions for duplicate
    // and unrequested blocks.
    if (fAlreadyHave) return true;
    if (!fRequested) {  // If we didn't ask for it:
        if (pindex->nTx != 0) return true;    // This is a previously-processed block that was pruned
        if (!fHasMoreOrSameWork) return true; // Don't process less-work chains
        if (fTooFarAhead) return true;        // Block height is too high

        // Protect against DoS attacks from low-work chains.
        // If our tip is behind, a peer could try to send us
        // low-work blocks on a fake chain that we would never
        // request; don't process these.
        if (pindex->nChainWork < MinimumChainWork()) return true;
    }

    const CChainParams& params{GetParams()};

    if (!CheckBlock(block, state, params.GetConsensus()) ||
        !ContextualCheckBlock(block, state, *this, pindex->pprev)) {
        if (state.IsInvalid() && state.GetResult() != BlockValidationResult::BLOCK_MUTATED) {
            pindex->nStatus |= BLOCK_FAILED_VALID;
            m_blockman.m_dirty_blockindex.insert(pindex);
        }
        LogError("%s: %s\n", __func__, state.ToString());
        return false;
    }

    // Header is valid/has work, merkle tree and segwit merkle tree are good...RELAY NOW
    // (but if it does not build on our best tip, let the SendMessages loop relay it)
    if (!IsInitialBlockDownload() && ActiveTip() == pindex->pprev && m_options.signals) {
        m_options.signals->NewPoWValidBlock(pindex, pblock);
    }

    // Write block to history file
    if (fNewBlock) *fNewBlock = true;
    try {
        FlatFilePos blockPos{};
        if (dbp) {
            blockPos = *dbp;
            m_blockman.UpdateBlockInfo(block, pindex->nHeight, blockPos);
        } else {
            blockPos = m_blockman.SaveBlockToDisk(block, pindex->nHeight);
            if (blockPos.IsNull()) {
                state.Error(strprintf("%s: Failed to find position to write new block to disk", __func__));
                return false;
            }
        }
        ReceivedBlockTransactions(block, pindex, blockPos);
    } catch (const std::runtime_error& e) {
        return FatalError(GetNotifications(), state, strprintf(_("System error while saving block to disk: %s"), e.what()));
    }

    // TODO: FlushStateToDisk() handles flushing of both block and chainstate
    // data, so we should move this to ChainstateManager so that we can be more
    // intelligent about how we flush.
    // For now, since FlushStateMode::NONE is used, all that can happen is that
    // the block files may be pruned, so we can just call this on one
    // chainstate (particularly if we haven't implemented pruning with
    // background validation yet).
    ActiveChainstate().FlushStateToDisk(state, FlushStateMode::NONE);

    CheckBlockIndex();

    return true;
}